

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
          (QPodArrayOps<QStringView> *this,qsizetype i,QStringView *args)

{
  QStringView **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  QStringView *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QStringView>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00336a74:
    qVar4 = args->m_size;
    psVar5 = args->m_data;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QStringView>).size != 0);
    QArrayDataPointer<QStringView>::detachAndGrow
              (&this->super_QArrayDataPointer<QStringView>,where,1,(QStringView **)0x0,
               (QArrayDataPointer<QStringView> *)0x0);
    pQVar6 = createHole(this,where,i,1);
    pQVar6->m_size = qVar4;
    pQVar6->m_data = psVar5;
  }
  else {
    if (((this->super_QArrayDataPointer<QStringView>).size == i) &&
       (pQVar6 = (this->super_QArrayDataPointer<QStringView>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      psVar5 = args->m_data;
      pQVar6 = pQVar6 + i;
      pQVar6->m_size = args->m_size;
      pQVar6->m_data = psVar5;
    }
    else {
      if ((i != 0) ||
         (pQVar6 = (this->super_QArrayDataPointer<QStringView>).ptr,
         (QStringView *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar6)) goto LAB_00336a74;
      psVar5 = args->m_data;
      pQVar6[-1].m_size = args->m_size;
      pQVar6[-1].m_data = psVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QStringView>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QStringView>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }